

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlpperf.c
# Opt level: O2

void benchmark(tlpperf *t)

{
  int iVar1;
  ulong uVar2;
  __sighandler_t p_Var3;
  char *__s;
  tlpperf_thread *__arg;
  pthread_t *ppVar4;
  ulong uVar5;
  long lVar6;
  pthread_t ctid;
  tlpperf_thread ths [16];
  
  __arg = ths;
  iVar1 = pthread_create(&ctid,(pthread_attr_t *)0x0,count_thread,__arg);
  if (iVar1 < 0) {
    fprintf(_stderr,"%s:ERR: failed to create count thread\n","benchmark");
    perror("pthread_create");
    exit(-1);
  }
  uVar5 = 0;
  memset(__arg,0,0x580);
  do {
    if ((long)t->nthreads <= (long)uVar5) {
      p_Var3 = signal(2,stop_all);
      if (p_Var3 == (__sighandler_t)0xffffffffffffffff) {
        __s = "cannot set seginal\n";
LAB_00102e9f:
        perror(__s);
      }
      else {
        ppVar4 = &ths[0].tid;
        for (lVar6 = 0; lVar6 < t->nthreads; lVar6 = lVar6 + 1) {
          pthread_join(*ppVar4,(void **)0x0);
          ppVar4 = ppVar4 + 0xb;
        }
        pthread_join(ctid,(void **)0x0);
      }
      return;
    }
    __arg->t = t;
    (__arg->nt).remote_addr.s_addr = (t->remote).s_addr;
    (__arg->nt).local_addr.s_addr = (t->local).s_addr;
    (__arg->nt).requester = t->requester;
    (__arg->nt).tag = (uint8_t)uVar5;
    iVar1 = nettlp_init(&__arg->nt);
    if (iVar1 < 0) {
      __s = "nettlp_init";
      goto LAB_00102e9f;
    }
    __arg->cpu = (int)uVar5;
    __arg->count = t->count;
    if (t->split == 1) {
      uVar2 = t->region_size / (ulong)(long)t->nthreads;
      __arg->region_addr = uVar2 * uVar5 + t->region_addr & 0xfffffffffffff000;
    }
    else {
      if (t->split != 0) {
        fprintf(_stderr,"%s:ERR: invalid region split pattern\n","benchmark");
        return;
      }
      __arg->region_addr = t->region_addr;
      uVar2 = t->region_size;
    }
    __arg->region_size = uVar2;
    iVar1 = pthread_create(&__arg->tid,(pthread_attr_t *)0x0,benchmark_thread,__arg);
    if (iVar1 < 0) {
      fprintf(_stderr,"%s:ERR: failed to create thread for cpu %d\n","benchmark",uVar5 & 0xffffffff)
      ;
      __s = "pthread_create";
      goto LAB_00102e9f;
    }
    usleep(0x14);
    uVar5 = uVar5 + 1;
    __arg = __arg + 1;
  } while( true );
}

Assistant:

void benchmark(struct tlpperf *t)
{
	int n;
	pthread_t ctid;	/* count_thread tid */
	struct tlpperf_thread ths[MAX_CPUS];

	if (pthread_create(&ctid, NULL, count_thread, ths) < 0) {
		pr_err("failed to create count thread\n");
		perror("pthread_create");
		exit(-1);
	}

	memset(ths, 0, sizeof(ths));

	for (n = 0; n < t->nthreads; n++) {
		struct tlpperf_thread *th = &ths[n];

		th->t = t;

		/* initialize nettlp for this thread */
		th->nt.remote_addr = t->remote;
		th->nt.local_addr = t->local;
		th->nt.requester = t->requester;
		th->nt.tag = n;	/* XXX */
		if (nettlp_init(&th->nt) < 0) {
			perror("nettlp_init");
			return;
		}

		/* fill the thread-specific parameters */
		th->cpu = n;	/* XXX */
		th->count = t->count;
		if (t->split == DMA_REGION_SPLIT_SAME) {
			th->region_addr = t->region_addr;
			th->region_size = t->region_size;
		} else if (t->split == DMA_REGION_SPLIT_DIFF) {
			th->region_addr = ((t->region_addr +
					    t->region_size / t->nthreads * n)
					   >> 12) << 12; /* 4k-byte align */
			th->region_size = t->region_size / t->nthreads;
		} else {
			pr_err("invalid region split pattern\n");
			return;
		}
		
		if (pthread_create(&th->tid, NULL, benchmark_thread, th) < 0) {
			pr_err("failed to create thread for cpu %d\n", n);
			perror("pthread_create");
			return;
		}

		usleep(20);	/* to serialize start output on each thread */
	}

	if (signal(SIGINT, stop_all) == SIG_ERR) {
		perror("cannot set seginal\n");
		return;
	}
	
	for (n = 0; n < t->nthreads; n++)
		pthread_join(ths[n].tid, NULL);
		
	pthread_join(ctid, NULL);

	return;
}